

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::
Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
operator[](Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,key_type *key)

{
  value_type *pvVar1;
  KeyValuePair kv;
  KeyValuePair local_48;
  pair<google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::iterator_base<google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>,_bool>
  local_38;
  
  local_48.k_ = *key;
  local_48.v_ = (value_type *)0x0;
  InnerMap::insert(&local_38,this->elements_,&local_48);
  pvVar1 = ((local_38.first.node_)->kv).v_;
  if (pvVar1 == (value_type *)0x0) {
    pvVar1 = CreateValueTypeInternal(this,key);
    ((local_38.first.node_)->kv).v_ = pvVar1;
  }
  return &pvVar1->second;
}

Assistant:

T& operator[](const key_type& key) {
    value_type** value =  &(*elements_)[key];
    if (*value == NULL) {
      *value = CreateValueTypeInternal(key);
      internal::MapValueInitializer<google::protobuf::is_proto_enum<T>::value,
                                    T>::Initialize((*value)->second,
                                                   default_enum_value_);
    }
    return (*value)->second;
  }